

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O2

uint * Vec_IntFetch(Vec_Int_t *p,int nWords)

{
  int iVar1;
  long lVar2;
  
  if (nWords != 0) {
    if (nWords < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x3a5,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar2 = (long)nWords + (long)p->nSize;
    iVar1 = (int)lVar2;
    p->nSize = iVar1;
    if (iVar1 <= p->nCap) {
      return (uint *)(p->pArray + (lVar2 - (ulong)(uint)nWords));
    }
  }
  return (uint *)0x0;
}

Assistant:

static inline unsigned * Vec_IntFetch( Vec_Int_t * p, int nWords )
{
    if ( nWords == 0 )
        return NULL;
    assert( nWords > 0 );
    p->nSize += nWords;
    if ( p->nSize > p->nCap )
    {
//         Vec_IntGrow( p, 2 * p->nSize );
        return NULL;
    }
    return ((unsigned *)p->pArray) + p->nSize - nWords;
}